

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_memory_storage.cpp
# Opt level: O3

void __thiscall
cppcms::sessions::session_memory_storage::save
          (session_memory_storage *this,string *key,time_t to,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  iterator pcVar4;
  iterator iVar5;
  pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container_*,_bool>
  pVar6;
  unique_lock<booster::shared_mutex> lock;
  unique_lock<booster::shared_mutex> local_118;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>
  local_108;
  value_type local_b8;
  _data local_68;
  
  local_118._M_device = &this->mutex_;
  local_118._M_owns = false;
  std::unique_lock<booster::shared_mutex>::lock(&local_118);
  local_118._M_owns = true;
  pcVar4 = cppcms::impl::details::
           basic_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>
           ::find<std::__cxx11::string>
                     ((basic_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>
                       *)&this->map_,key);
  if (pcVar4 == (iterator)0x0) {
    local_68.info._M_dataplus._M_p = (pointer)&local_68.info.field_2;
    local_68.timeout = 0;
    local_68.info._M_string_length = 0;
    local_68.info.field_2._8_8_ = 0;
    local_68.timeout_ptr._M_node = (_Base_ptr)0x0;
    local_68.info.field_2._M_allocated_capacity = 0;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>
    ::pair<cppcms::sessions::session_memory_storage::_data,_true>(&local_108,key,&local_68);
    local_b8.first._M_dataplus._M_p = (pointer)&local_b8.first.field_2;
    paVar1 = &local_108.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.first._M_dataplus._M_p == paVar1) {
      local_b8.first.field_2._8_8_ = local_108.first.field_2._8_8_;
    }
    else {
      local_b8.first._M_dataplus._M_p = local_108.first._M_dataplus._M_p;
    }
    paVar2 = &local_108.second.info.field_2;
    paVar3 = &local_b8.second.info.field_2;
    local_b8.first._M_string_length = local_108.first._M_string_length;
    local_108.first._M_string_length = 0;
    local_108.first.field_2._M_local_buf[0] = '\0';
    local_b8.second.timeout = local_108.second.timeout;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.second.info._M_dataplus._M_p == paVar2) {
      local_b8.second.info.field_2._8_8_ = local_108.second.info.field_2._8_8_;
      local_b8.second.info._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_b8.second.info._M_dataplus._M_p = local_108.second.info._M_dataplus._M_p;
    }
    local_b8.second.info._M_string_length = local_108.second.info._M_string_length;
    local_108.second.info._M_string_length = 0;
    local_108.second.info.field_2._M_local_buf[0] = '\0';
    local_b8.second.timeout_ptr._M_node = local_108.second.timeout_ptr._M_node;
    local_108.first._M_dataplus._M_p = (pointer)paVar1;
    local_108.second.info._M_dataplus._M_p = (pointer)paVar2;
    pVar6 = cppcms::impl::details::
            basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>
            ::insert(&(this->map_).impl_,&local_b8);
    pcVar4 = pVar6.first;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.second.info._M_dataplus._M_p != paVar3) {
      operator_delete(local_b8.second.info._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.first._M_dataplus._M_p != &local_b8.first.field_2) {
      operator_delete(local_b8.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.second.info._M_dataplus._M_p != paVar2) {
      operator_delete(local_108.second.info._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.first._M_dataplus._M_p != &local_108.first.field_2) {
      operator_delete(local_108.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.info._M_dataplus._M_p != &local_68.info.field_2) {
      operator_delete(local_68.info._M_dataplus._M_p);
    }
    (pcVar4->val).second.timeout = to;
    std::__cxx11::string::_M_assign((string *)&(pcVar4->val).second.info);
    local_b8.first._M_dataplus._M_p = (pointer)to;
    local_b8.first._M_string_length = (size_type)pcVar4;
    iVar5 = std::
            _Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>,std::less<long>,std::allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>>
            ::
            _M_emplace_equal<std::pair<long,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>
                      ((_Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>,std::less<long>,std::allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>>
                        *)&this->timeout_,
                       (pair<long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::iterator>
                        *)&local_b8);
    (pcVar4->val).second.timeout_ptr._M_node = iVar5._M_node;
  }
  else {
    std::
    _Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>,std::less<long>,std::allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>>
    ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>,std::less<long>,std::allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>>
                        *)&this->timeout_,(pcVar4->val).second.timeout_ptr._M_node);
    (pcVar4->val).second.timeout = to;
    std::__cxx11::string::_M_assign((string *)&(pcVar4->val).second.info);
    local_b8.first._M_dataplus._M_p = (pointer)to;
    local_b8.first._M_string_length = (size_type)pcVar4;
    iVar5 = std::
            _Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>,std::less<long>,std::allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>>
            ::
            _M_emplace_equal<std::pair<long,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>
                      ((_Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>,std::less<long>,std::allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>>
                        *)&this->timeout_,
                       (pair<long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::iterator>
                        *)&local_b8);
    (pcVar4->val).second.timeout_ptr._M_node = iVar5._M_node;
  }
  short_gc(this);
  std::unique_lock<booster::shared_mutex>::~unique_lock(&local_118);
  return;
}

Assistant:

void save(std::string const &key,time_t to,std::string const &value)
	{
		booster::unique_lock<booster::shared_mutex> lock(mutex_);
		pointer p=map_.find(key);
		if(p==map_.end()) {
			std::pair<pointer,bool> pr = map_.insert(std::pair<std::string,_data>(key,_data()));
			pointer p = pr.first;
			p->second.timeout=to;
			p->second.info=value;
			p->second.timeout_ptr=timeout_.insert(std::pair<time_t,pointer>(to,p));
		}
		else {
			timeout_.erase(p->second.timeout_ptr);
			p->second.timeout=to;
			p->second.info=value;
			p->second.timeout_ptr=timeout_.insert(std::pair<time_t,pointer>(to,p));
		}
		short_gc();
	}